

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O1

void __thiscall
ft::treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::rotateRight
          (treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *this,node *x)

{
  treeNode<int> *ptVar1;
  treeNode<int> *ptVar2;
  
  ptVar1 = x->left;
  ptVar2 = ptVar1->right;
  x->left = ptVar2;
  if (ptVar2 != (this->m_tree).NIL) {
    ptVar2->parent = x;
  }
  ptVar1->parent = x->parent;
  if (((this->m_tree).m_root == x) ||
     (this = (treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)x->parent,
     (this->m_tree).m_root == x)) {
    this = (treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)&this->m_tree;
  }
  else if ((this->m_tree).NIL != x) goto LAB_001084e1;
  (this->m_tree).NIL = ptVar1;
LAB_001084e1:
  ptVar1->right = x;
  x->parent = ptVar1;
  return;
}

Assistant:

void rotateRight(node* x)
	{
		node*	y = x->left;

		x->left = y->right;
		if (y->right != this->NIL())
			y->right->parent = x;
		y->parent = x->parent;
		if (x == this->root())
			this->m_tree.m_root = y;
		else if (x == x->parent->right)
			x->parent->right = y;
		else if (x == x->parent->left)
			x->parent->left = y;
		y->right = x;
		x->parent = y;
	}